

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.c
# Opt level: O3

int client_connect(char *fileName)

{
  int __fd;
  int iVar1;
  ssize_t sVar2;
  char *__s;
  char buffer [256];
  undefined1 local_186 [18];
  undefined8 local_174;
  undefined8 uStack_16c;
  undefined8 local_164;
  undefined8 uStack_15c;
  undefined8 local_154;
  undefined8 uStack_14c;
  undefined8 local_144;
  undefined8 uStack_13c;
  undefined8 uStack_134;
  undefined4 uStack_12c;
  undefined4 local_128;
  undefined4 uStack_124;
  undefined8 uStack_120;
  char local_118 [256];
  
  __fd = socket(1,1,0);
  if (__fd < 0) {
    __s = "socket() failed";
  }
  else {
    uStack_124 = 0;
    uStack_120 = 0;
    uStack_134 = 0;
    uStack_12c = 0;
    local_128 = 0;
    local_144 = 0;
    uStack_13c = 0;
    local_154 = 0;
    uStack_14c = 0;
    local_164 = 0;
    uStack_15c = 0;
    local_174 = 0;
    uStack_16c = 0;
    local_186[2] = '\0';
    local_186[3] = '\0';
    local_186[4] = '\0';
    local_186[5] = '\0';
    local_186[6] = '\0';
    local_186[7] = '\0';
    local_186[8] = '\0';
    local_186[9] = '\0';
    local_186._10_8_ = 0;
    local_186._0_2_ = 1;
    sprintf(local_186 + 2,fileName);
    iVar1 = connect(__fd,(sockaddr *)local_186,0x6e);
    if (iVar1 == 0) {
      builtin_strncpy(local_118,"hello from a client",0x14);
      write(__fd,local_118,0x13);
      sVar2 = read(__fd,local_118,0x100);
      local_118[(int)sVar2] = '\0';
      printf("message from server: %s\n",local_118);
      close(__fd);
      return 0;
    }
    __s = "connect() failed";
  }
  puts(__s);
  return -1;
}

Assistant:

int client_connect(const char* fileName)
{
    int socket_fd = socket(PF_UNIX, SOCK_STREAM, 0);
    if(socket_fd < 0)
    {
        printf("socket() failed\n");
        return (-1);
    }

    struct sockaddr_un address;
    memset(&address, 0, sizeof(struct sockaddr_un));
    address.sun_family = AF_UNIX;
    sprintf(address.sun_path, fileName);

    if(connect(socket_fd, (struct sockaddr*)&address, sizeof(struct sockaddr_un)) != 0)
    {
        printf("connect() failed\n");
        return (-1);
    }

    char buffer[256];
    int nBytes = snprintf(buffer, 256, "hello from a client");
    write(socket_fd, buffer, nBytes);

    nBytes = read(socket_fd, buffer, 256);
    buffer[nBytes] = 0;

    printf("message from server: %s\n", buffer);

    close(socket_fd);

    return 0;
}